

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_add_tri(REF_CAVITY ref_cavity,REF_INT tri)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  REF_INT already_have_it;
  REF_INT all_local;
  REF_INT seg_nodes [3];
  int local_50;
  int local_4c;
  long local_48;
  REF_INT local_3c [3];
  
  if (-1 < tri) {
    ref_cell = ref_cavity->ref_grid->cell[3];
    if ((tri < ref_cell->max) && (ref_cell->c2n[(long)ref_cell->size_per * (long)tri] != -1)) {
      ref_node = ref_cavity->ref_grid->node;
      uVar4 = ref_list_contains(ref_cavity->tri_list,tri,&local_50);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x213,"ref_cavity_add_tri",(ulong)uVar4,"have tri?");
        return uVar4;
      }
      if (local_50 != 0) {
        return 0;
      }
      local_48 = (long)tri;
      uVar4 = ref_cell_all_local(ref_cell,ref_node,tri,&local_4c);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x216,"ref_cavity_add_tri",(ulong)uVar4,"local cell");
        return uVar4;
      }
      if (local_4c != 0) {
        uVar4 = ref_list_push(ref_cavity->tri_list,tri);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x21c,"ref_cavity_add_tri",(ulong)uVar4,"save tri");
          return uVar4;
        }
        if (ref_cell->edge_per < 1) {
          return 0;
        }
        lVar7 = 0;
        lVar6 = 0;
        do {
          pRVar2 = ref_cell->c2n;
          iVar1 = ref_cell->size_per;
          pRVar3 = ref_cell->e2n;
          lVar5 = 0;
          do {
            local_3c[lVar5] =
                 pRVar2[(long)*(int *)((long)pRVar3 + lVar5 * 4 + lVar7) + iVar1 * local_48];
            lVar5 = lVar5 + 1;
          } while (lVar5 == 1);
          local_3c[2] = ref_cell->c2n[ref_cell->size_per * local_48 + (long)ref_cell->node_per];
          uVar4 = ref_cavity_insert_seg(ref_cavity,local_3c);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x223,"ref_cavity_add_tri",(ulong)uVar4,"tri side");
            return uVar4;
          }
          if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
            return 0;
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 8;
        } while (lVar6 < ref_cell->edge_per);
        return 0;
      }
      ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
      return 0;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x210,
         "ref_cavity_add_tri","invalid tri");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_add_tri(REF_CAVITY ref_cavity, REF_INT tri) {
  REF_CELL ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT cell_edge, node;
  REF_INT seg_nodes[3];
  REF_INT all_local, already_have_it;

  RAS(ref_cell_valid(ref_cell, tri), "invalid tri");

  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri, &already_have_it),
      "have tri?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_cell_all_local(ref_cell, ref_node, tri, &all_local), "local cell");
  if (!all_local) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), tri), "save tri");

  each_ref_cell_cell_edge(ref_cell, cell_edge) {
    each_ref_cavity_seg_node(ref_cavity, node) {
      seg_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, tri);
    }
    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), tri);
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}